

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O0

void __thiscall w3Interp::Min_f32(w3Interp *this)

{
  float *__a;
  float *pfVar1;
  float *z1;
  w3Interp *pwStack_10;
  float z2;
  w3Interp *this_local;
  
  pwStack_10 = this;
  z1._4_4_ = w3Stack::pop_f32(&this->super_w3Stack);
  __a = w3Stack::f32(&this->super_w3Stack);
  pfVar1 = std::min<float>(__a,(float *)((long)&z1 + 4));
  *__a = *pfVar1;
  return;
}

Assistant:

INTERP (Min_f32)
{
    const float z2 = pop_f32 ();
    float& z1 = f32 ();
    z1 = std::min (z1, z2);
}